

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

long __thiscall kws::Parser::GetLineNumber(Parser *this,size_t pos,bool withoutComments)

{
  ulong *puVar1;
  pointer ppVar2;
  ulong *puVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  
  if ((int)CONCAT71(in_register_00000011,withoutComments) != 0) {
    for (ppVar2 = (this->m_CommentPositions).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (ppVar2 != (this->m_CommentPositions).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish && (ppVar2->first <= pos));
        ppVar2 = ppVar2 + 1) {
      pos = (pos - ppVar2->first) + ppVar2->second;
    }
  }
  puVar3 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    uVar4 = 0;
    do {
      if (pos <= *puVar3) {
        return (ulong)uVar4;
      }
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  return 0;
}

Assistant:

long int Parser::GetLineNumber(size_t pos,bool withoutComments) const
{

  // if we have comments we add them to the list
  if(withoutComments)
    {
    pos = this->GetPositionWithComments(pos);
    }

  unsigned int i=0;
  auto it = m_Positions.begin();
  while(it != m_Positions.end())
    {
    if(pos<=(*it))
      {
      return i;
      }
    i++;
    it++;
    }
  return 0;
}